

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O1

void __thiscall
TasGrid::GridLocalPolynomial::readConstructionData
          (GridLocalPolynomial *this,istream *is,bool iomode)

{
  int *args_2;
  int *args_3;
  _Head_base<0UL,_TasGrid::SimpleConstructData_*,_false> __ptr;
  _Head_base<0UL,_TasGrid::SimpleConstructData_*,_false> _Var1;
  undefined7 in_register_00000011;
  unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
  *this_00;
  _Head_base<0UL,_TasGrid::SimpleConstructData_*,_false> local_18;
  
  args_2 = &(this->super_BaseCanonicalGrid).num_dimensions;
  args_3 = &(this->super_BaseCanonicalGrid).num_outputs;
  this_00 = &this->dynamic_values;
  if ((int)CONCAT71(in_register_00000011,iomode) == 0) {
    Utils::
    make_unique<TasGrid::SimpleConstructData,std::istream&,int&,int&,TasGrid::IO::mode_ascii_type>
              ((basic_istream<char,_std::char_traits<char>_> *)&local_18,(int *)is,args_2,
               (mode_ascii_type *)args_3);
  }
  else {
    Utils::
    make_unique<TasGrid::SimpleConstructData,std::istream&,int&,int&,TasGrid::IO::mode_binary_type>
              ((basic_istream<char,_std::char_traits<char>_> *)&local_18,(int *)is,args_2,
               (mode_binary_type *)args_3);
  }
  _Var1._M_head_impl = local_18._M_head_impl;
  local_18._M_head_impl = (SimpleConstructData *)0x0;
  __ptr._M_head_impl =
       (this_00->_M_t).
       super___uniq_ptr_impl<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
       ._M_t.
       super__Tuple_impl<0UL,_TasGrid::SimpleConstructData_*,_std::default_delete<TasGrid::SimpleConstructData>_>
       .super__Head_base<0UL,_TasGrid::SimpleConstructData_*,_false>._M_head_impl;
  (this_00->_M_t).
  super___uniq_ptr_impl<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
  ._M_t.
  super__Tuple_impl<0UL,_TasGrid::SimpleConstructData_*,_std::default_delete<TasGrid::SimpleConstructData>_>
  .super__Head_base<0UL,_TasGrid::SimpleConstructData_*,_false>._M_head_impl = _Var1._M_head_impl;
  if (__ptr._M_head_impl != (SimpleConstructData *)0x0) {
    ::std::default_delete<TasGrid::SimpleConstructData>::operator()
              ((default_delete<TasGrid::SimpleConstructData> *)this_00,__ptr._M_head_impl);
  }
  if (local_18._M_head_impl != (SimpleConstructData *)0x0) {
    ::std::default_delete<TasGrid::SimpleConstructData>::operator()
              ((default_delete<TasGrid::SimpleConstructData> *)&local_18,local_18._M_head_impl);
  }
  return;
}

Assistant:

void GridLocalPolynomial::readConstructionData(std::istream &is, bool iomode){
    if (iomode == mode_ascii)
        dynamic_values = Utils::make_unique<SimpleConstructData>(is, num_dimensions, num_outputs, IO::mode_ascii_type());
    else
        dynamic_values = Utils::make_unique<SimpleConstructData>(is, num_dimensions, num_outputs, IO::mode_binary_type());
}